

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_cast.cpp
# Opt level: O3

long __thiscall
duckdb::DecimalScaleUpOperator::Operation<duckdb::hugeint_t,long>
          (DecimalScaleUpOperator *this,hugeint_t input,ValidityMask *mask,idx_t idx,void *dataptr)

{
  bool bVar1;
  InvalidInputException *this_00;
  int64_t iVar2;
  hugeint_t input_00;
  hugeint_t input_01;
  long result;
  long local_48;
  string local_40;
  
  input_01.lower = input.lower;
  iVar2 = 0;
  input_01.upper = (int64_t)&local_48;
  bVar1 = TryCast::Operation<duckdb::hugeint_t,long>
                    ((TryCast *)this,input_01,(int64_t *)0x0,SUB81(idx,0));
  if (bVar1) {
    return local_48 * *(long *)(idx + 0x30);
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  input_00.upper = iVar2;
  input_00.lower = input_01.lower;
  CastExceptionText<duckdb::hugeint_t,long>(&local_40,(duckdb *)this,input_00);
  InvalidInputException::InvalidInputException(this_00,(string *)&local_40);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, ValidityMask &mask, idx_t idx, void *dataptr) {
		auto data = (DecimalScaleInput<INPUT_TYPE, RESULT_TYPE> *)dataptr;
		return Cast::Operation<INPUT_TYPE, RESULT_TYPE>(input) * data->factor;
	}